

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O2

SynBase * ParseType(ParseContext *ctx,bool *shrBorrow,bool onlyType)

{
  IntrusiveList<SynBase> arguments;
  IntrusiveList<SynBase> sizes_00;
  bool bVar1;
  int iVar2;
  bool *pbVar3;
  SynTypeFunction *type;
  SynBase *pSVar4;
  undefined4 extraout_var;
  Lexeme *end;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Lexeme *pLVar5;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  IntrusiveList<SynBase> *key;
  SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *this;
  bool shrBorrowTerminal;
  bool local_61;
  Lexeme *local_60;
  IntrusiveList<SynBase> sizes;
  undefined1 local_44 [20];
  
  pLVar5 = ctx->currentLexeme;
  this = &ctx->nonTypeLocations;
  sizes.head._0_4_ = (int)((ulong)((long)pLVar5 - (long)ctx->firstLexeme) >> 5) + 1;
  pbVar3 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                     (this,(uint *)&sizes);
  if (pbVar3 == (bool *)0x0) {
    if (shrBorrow == (bool *)0x0) {
      shrBorrowTerminal = false;
    }
    else {
      shrBorrowTerminal = *shrBorrow;
    }
    type = (SynTypeFunction *)ParseTerminalType(ctx,&shrBorrowTerminal);
    if (type != (SynTypeFunction *)0x0) {
      if (shrBorrowTerminal == true) {
        if (shrBorrow == (bool *)0x0) {
          ctx->currentLexeme = pLVar5;
          sizes.head._0_4_ = (int)((ulong)((long)pLVar5 - (long)ctx->firstLexeme) >> 5) + 1;
          key = &sizes;
          pbVar3 = (bool *)local_44;
          local_44[0] = 1;
LAB_00111dad:
          SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                    (this,(uint *)key,pbVar3);
          return (SynBase *)0x0;
        }
        *shrBorrow = true;
      }
      local_60 = pLVar5;
      local_44._4_8_ = this;
      do {
        while( true ) {
          while( true ) {
            pLVar5 = ctx->currentLexeme;
            if (pLVar5->type == lex_ref) break;
            if (pLVar5->type != lex_obracket) {
              return &type->super_SynBase;
            }
            sizes.head._0_4_ = 0;
            sizes.head._4_4_ = 0;
            sizes.tail = (SynBase *)0x0;
            local_44._12_8_ = type;
            while (pLVar5->type == lex_obracket) {
              ctx->currentLexeme = pLVar5 + 1;
              pSVar4 = ParseTernaryExpr(ctx);
              if ((pSVar4 != (SynBase *)0x0) && (ctx->currentLexeme->type != lex_cbracket)) {
                if (onlyType) {
                  anon_unknown.dwarf_147a9::Report
                            (ctx,ctx->currentLexeme,"ERROR: \']\' not found after expression");
                }
                ctx->currentLexeme = local_60;
                local_44._0_4_ = (int)((ulong)((long)local_60 - (long)ctx->firstLexeme) >> 5) + 1;
                key = (IntrusiveList<SynBase> *)local_44;
                pbVar3 = &local_61;
                local_61 = true;
                this = (SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *)
                       local_44._4_8_;
                goto LAB_00111dad;
              }
              bVar1 = anon_unknown.dwarf_147a9::CheckConsume
                                (ctx,lex_cbracket,"ERROR: matching \']\' not found");
              if (pSVar4 == (SynBase *)0x0) {
                iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
                pSVar4 = (SynBase *)CONCAT44(extraout_var,iVar2);
                if (bVar1) {
                  end = ParseContext::Previous(ctx);
                }
                else {
                  end = ctx->currentLexeme;
                }
                SynNothing::SynNothing((SynNothing *)pSVar4,pLVar5 + 1,end);
              }
              IntrusiveList<SynBase>::push_back(&sizes,pSVar4);
              pLVar5 = ctx->currentLexeme;
            }
            iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
            pLVar5 = ParseContext::Previous(ctx);
            sizes_00.head._4_4_ = sizes.head._4_4_;
            sizes_00.head._0_4_ = (int)sizes.head;
            sizes_00.tail = sizes.tail;
            SynTypeArray::SynTypeArray
                      ((SynTypeArray *)CONCAT44(extraout_var_01,iVar2),local_60,pLVar5,
                       (SynBase *)local_44._12_8_,sizes_00);
            type = (SynTypeFunction *)CONCAT44(extraout_var_01,iVar2);
          }
          ctx->currentLexeme = pLVar5 + 1;
          if (pLVar5[1].type == lex_oparen) break;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pLVar5 = ParseContext::Previous(ctx);
          SynTypeReference::SynTypeReference
                    ((SynTypeReference *)CONCAT44(extraout_var_02,iVar2),local_60,pLVar5,
                     &type->super_SynBase);
          type = (SynTypeFunction *)CONCAT44(extraout_var_02,iVar2);
        }
        ctx->currentLexeme = pLVar5 + 2;
        sizes.head._0_4_ = 0;
        sizes.head._4_4_ = 0;
        sizes.tail = (SynBase *)0x0;
        pSVar4 = ParseType(ctx,(bool *)0x0,false);
        if (pSVar4 != (SynBase *)0x0) {
          do {
            IntrusiveList<SynBase>::push_back(&sizes,pSVar4);
            if (ctx->currentLexeme->type != lex_comma) goto LAB_00111c6b;
            ctx->currentLexeme = ctx->currentLexeme + 1;
            pSVar4 = ParseType(ctx,(bool *)0x0,false);
          } while (pSVar4 != (SynBase *)0x0);
          anon_unknown.dwarf_147a9::Report
                    (ctx,ctx->currentLexeme,"ERROR: type is expected after \',\'");
        }
LAB_00111c6b:
        if (ctx->currentLexeme->type != lex_cparen) {
          ctx->currentLexeme = pLVar5 + 1;
          iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
          pLVar5 = ParseContext::Previous(ctx);
          SynTypeReference::SynTypeReference
                    ((SynTypeReference *)CONCAT44(extraout_var_03,iVar2),local_60,pLVar5,
                     &type->super_SynBase);
          return &((SynTypeReference *)CONCAT44(extraout_var_03,iVar2))->super_SynBase;
        }
        ctx->currentLexeme = ctx->currentLexeme + 1;
        iVar2 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x58);
        pLVar5 = ParseContext::Previous(ctx);
        arguments.head._4_4_ = sizes.head._4_4_;
        arguments.head._0_4_ = (int)sizes.head;
        arguments.tail = sizes.tail;
        SynTypeFunction::SynTypeFunction
                  ((SynTypeFunction *)CONCAT44(extraout_var_00,iVar2),local_60,pLVar5,
                   &type->super_SynBase,arguments);
        type = (SynTypeFunction *)CONCAT44(extraout_var_00,iVar2);
      } while( true );
    }
  }
  return (SynBase *)0x0;
}

Assistant:

SynBase* ParseType(ParseContext &ctx, bool *shrBorrow, bool onlyType)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonTypeLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool shrBorrowTerminal = shrBorrow ? *shrBorrow : false;

	SynBase *base = ParseTerminalType(ctx, shrBorrowTerminal);
	
	if(!base)
		return NULL;

	if(shrBorrowTerminal)
	{
		if(!shrBorrow)
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}
		else
		{
			*shrBorrow = true;
		}
	}

	while(ctx.At(lex_obracket) || ctx.At(lex_ref))
	{
		if(ctx.At(lex_obracket))
		{
			IntrusiveList<SynBase> sizes;

			while(ctx.Consume(lex_obracket))
			{
				Lexeme *sizeStart = ctx.currentLexeme;

				SynBase *size = ParseTernaryExpr(ctx);

				if(size && !ctx.At(lex_cbracket))
				{
					if(onlyType)
						Report(ctx, ctx.Current(), "ERROR: ']' not found after expression");

					// Backtrack
					ctx.currentLexeme = start;
					ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

					return NULL;
				}

				bool hasClose = CheckConsume(ctx, lex_cbracket, "ERROR: matching ']' not found");

				if(size)
					sizes.push_back(size);
				else
					sizes.push_back(new (ctx.get<SynNothing>()) SynNothing(sizeStart, hasClose ? ctx.Previous() : ctx.Current()));
			}

			base = new (ctx.get<SynTypeArray>()) SynTypeArray(start, ctx.Previous(), base, sizes);
		}
		else if(ctx.Consume(lex_ref))
		{
			Lexeme *refLexeme = ctx.currentLexeme;

			if(ctx.Consume(lex_oparen))
			{
				IntrusiveList<SynBase> arguments;

				if(SynBase *argument = ParseType(ctx))
				{
					arguments.push_back(argument);

					while(ctx.Consume(lex_comma))
					{
						argument = ParseType(ctx);

						if(!argument)
						{
							Report(ctx, ctx.Current(), "ERROR: type is expected after ','");

							break;
						}

						arguments.push_back(argument);
					}
				}

				if(!ctx.Consume(lex_cparen))
				{
					// Backtrack
					ctx.currentLexeme = refLexeme;

					return new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
				}

				base = new (ctx.get<SynTypeFunction>()) SynTypeFunction(start, ctx.Previous(), base, arguments);
			}
			else
			{
				base = new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
			}
		}
	}

	return base;
}